

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle_private.hh
# Opt level: O0

Members * __thiscall qpdf::Stream::stream(Stream *this)

{
  unique_ptr<QPDF_Stream::Members,_std::default_delete<QPDF_Stream::Members>_> *this_00;
  pointer pMVar1;
  logic_error *this_01;
  runtime_error *this_02;
  pointer ptr;
  QPDF_Stream *s;
  Stream *this_local;
  
  this_00 = &BaseHandle::as<QPDF_Stream>(&this->super_BaseHandle)->m;
  if (this_00 == (unique_ptr<QPDF_Stream::Members,_std::default_delete<QPDF_Stream::Members>_> *)0x0
     ) {
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,"operation for stream attempted on non-stream object")
    ;
    __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pMVar1 = std::unique_ptr<QPDF_Stream::Members,_std::default_delete<QPDF_Stream::Members>_>::get
                     (this_00);
  if (pMVar1 != (pointer)0x0) {
    return pMVar1;
  }
  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_01,"QPDF_Stream: unexpected nullptr");
  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

QPDF_Stream::Members*
        stream() const
        {
            if (auto s = as<QPDF_Stream>()) {
                if (auto ptr = s->m.get()) {
                    return ptr;
                }
                throw std::logic_error("QPDF_Stream: unexpected nullptr");
            }
            throw std::runtime_error("operation for stream attempted on non-stream object");
            return nullptr; // unreachable
        }